

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNUnit.cpp
# Opt level: O3

NaReal __thiscall
NaNNUnit::ScaleData(NaNNUnit *this,NaScaler *rSrcScaler,NaScaler *rDstScaler,NaReal fSrcVal,
                   uint iIndex)

{
  NaReal NVar1;
  NaReal NVar2;
  double dVar3;
  double dVar4;
  
  NVar1 = NaVector::operator()(&rDstScaler->max,iIndex);
  NVar2 = NaVector::operator()(&rDstScaler->min,iIndex);
  dVar3 = NVar1 - NVar2;
  NVar1 = NaVector::operator()(&rSrcScaler->max,iIndex);
  NVar2 = NaVector::operator()(&rSrcScaler->min,iIndex);
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    dVar4 = NVar1 - NVar2;
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      NVar1 = NaVector::operator()(&rDstScaler->min,iIndex);
      NVar2 = NaVector::operator()(&rSrcScaler->min,iIndex);
      fSrcVal = (dVar3 * (fSrcVal - NVar2)) / dVar4 + NVar1;
    }
  }
  return fSrcVal;
}

Assistant:

NaReal
NaNNUnit::ScaleData (const NaNNUnit::NaScaler& rSrcScaler,
                     const NaNNUnit::NaScaler& rDstScaler,
                     NaReal fSrcVal,
		     unsigned iIndex) const
{
  NaReal  fDstDiff = rDstScaler.max(iIndex) - rDstScaler.min(iIndex);
  NaReal  fSrcDiff = rSrcScaler.max(iIndex) - rSrcScaler.min(iIndex);
  NaReal  fDstVal = fSrcVal;

  // Preveint scaling if some difference is zero
  if(0 != fDstDiff && 0 != fSrcDiff)
    {
      fDstVal = rDstScaler.min(iIndex)
	+ (fSrcVal - rSrcScaler.min(iIndex)) * fDstDiff / fSrcDiff;
    }

#if defined(NNUnit_SCALE)
  NaPrintLog("ScaleData(%u) [%g,%g]->[%g,%g] ==> %g -> %g\n", iIndex,
	     rSrcScaler.min(iIndex), rSrcScaler.max(iIndex),
	     rDstScaler.min(iIndex), rDstScaler.max(iIndex),
	     fSrcVal, fDstVal);
#endif // NNUnit_SCALE
  return fDstVal;
}